

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_color_pick(nk_context *ctx,nk_color *color,nk_color_format fmt)

{
  nk_vec2 nVar1;
  nk_window *pnVar2;
  nk_panel *pnVar3;
  nk_user_font *pnVar4;
  undefined1 auVar5 [12];
  nk_color *pnVar6;
  nk_widget_layout_states nVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  nk_color nVar11;
  int iVar12;
  long lVar13;
  nk_command_buffer *b;
  nk_context *i;
  nk_flags nVar14;
  nk_flags *state;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [12];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  nk_rect r;
  nk_rect r_00;
  nk_rect r_01;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect rect_03;
  nk_rect rect_04;
  nk_rect rect_05;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8;
  float fStack_d4;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [16];
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  nk_rect bounds;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5491,
                  "int nk_color_pick(struct nk_context *, struct nk_color *, enum nk_color_format)")
    ;
  }
  if (color == (nk_color *)0x0) {
    __assert_fail("color",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5492,
                  "int nk_color_pick(struct nk_context *, struct nk_color *, enum nk_color_format)")
    ;
  }
  pnVar2 = ctx->current;
  if (pnVar2 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5493,
                  "int nk_color_pick(struct nk_context *, struct nk_color *, enum nk_color_format)")
    ;
  }
  pnVar3 = pnVar2->layout;
  if (pnVar3 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5494,
                  "int nk_color_pick(struct nk_context *, struct nk_color *, enum nk_color_format)")
    ;
  }
  nVar7 = nk_widget(&bounds,ctx);
  if (nVar7 == NK_WIDGET_INVALID) {
    return 0;
  }
  i = (nk_context *)0x0;
  if ((nVar7 != NK_WIDGET_ROM) && ((pnVar3->flags & 0x1000) == 0)) {
    i = ctx;
  }
  pnVar4 = (ctx->style).font;
  if (pnVar4 == (nk_user_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4028,
                  "int nk_do_color_picker(nk_flags *, struct nk_command_buffer *, struct nk_color *, enum nk_color_format, struct nk_rect, struct nk_vec2, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  state = &ctx->last_widget_state;
  fVar22 = bounds.h;
  fVar18 = pnVar4->height;
  local_98 = ZEXT416((uint)fVar18);
  fVar23 = bounds.x + 0.0;
  fVar24 = bounds.y + 0.0;
  fVar15 = fVar18 + fVar18 + 0.0;
  local_58._0_4_ = bounds.w - fVar15;
  register0x00001244 = (ulong)bounds._8_8_ >> 0x20;
  fStack_4c = 0.0;
  local_88 = CONCAT44(fVar22,bounds.w - fVar15);
  uStack_80 = 0;
  local_d8 = bounds.w;
  fStack_d4 = bounds.h;
  uStack_d0 = 0;
  local_b8._4_4_ = fVar22;
  local_b8._0_4_ = fVar18;
  local_b8._8_8_ = 0;
  local_e8 = CONCAT44(fVar24,fVar23 + (float)local_58._0_4_);
  uStack_e0 = 0;
  local_c8 = CONCAT44(fVar24,fVar23 + (float)local_58._0_4_);
  uStack_c0 = 0;
  local_78 = color;
  nk_color_hsva_fv(&local_f8,*color);
  r.y = fVar24;
  r.x = fVar23;
  iVar12 = 1;
  r.w = (float)(undefined4)local_88;
  r.h = (float)local_88._4_4_;
  iVar8 = nk_button_behavior(state,r,&i->input,NK_BUTTON_REPEATER);
  auVar17 = local_b8;
  if (iVar8 == 0) {
    iVar12 = 0;
  }
  else {
    auVar20._0_4_ = (float)local_58._0_4_ + -1.0;
    auVar20._4_4_ = fStack_d4 + -1.0;
    auVar20._8_4_ = (float)uStack_d0 + 0.0;
    auVar20._12_4_ = uStack_d0._4_4_ + 0.0;
    nVar1 = (i->input).mouse.pos;
    auVar16._0_4_ = nVar1.x - fVar23;
    auVar16._4_4_ = nVar1.y - fVar24;
    auVar16._8_8_ = 0;
    auVar16 = divps(auVar16,auVar20);
    fVar18 = auVar16._4_4_;
    auVar21._4_4_ = -(uint)(0.0 < auVar16._0_4_);
    auVar21._0_4_ = -(uint)(0.0 < fVar18);
    auVar21._8_4_ = -(uint)(1.0 < fVar18);
    auVar21._12_4_ = -(uint)(1.0 < auVar16._0_4_);
    uVar9 = movmskps(iVar8,auVar21);
    local_f4 = 1.0;
    fVar15 = local_f4;
    if ((uVar9 & 1) == 0) {
      fVar15 = 0.0;
    }
    local_f0 = 1.0;
    if ((uVar9 & 4) == 0) {
      local_f0 = fVar15;
    }
    if ((uVar9 & 1) == 0) {
      fVar18 = local_f0;
    }
    if ((uVar9 & 4) == 0) {
      local_f0 = fVar18;
    }
    if ((uVar9 & 10) == 0) {
      local_f4 = 0.0;
    }
    if ((uVar9 & 2) == 0) {
      auVar16 = ZEXT416((uint)local_f4);
    }
    if ((uVar9 & 8) == 0) {
      local_f4 = auVar16._0_4_;
    }
    local_f0 = 1.0 - local_f0;
  }
  local_a8 = (float)local_98._0_4_ + (float)local_e8;
  uStack_a4 = local_98._4_4_;
  uStack_a0 = local_98._8_4_;
  uStack_9c = local_98._12_4_;
  r_00.w = (float)local_b8._0_4_;
  r_00.h = (float)local_b8._4_4_;
  r_00.x = (float)local_c8;
  r_00.y = (float)local_c8._4_4_;
  local_b8 = auVar17;
  iVar8 = nk_button_behavior(state,r_00,&i->input,NK_BUTTON_REPEATER);
  auVar16 = local_b8;
  auVar17._4_4_ = fVar24;
  auVar17._0_4_ = fVar23;
  auVar17._8_8_ = 0;
  if (iVar8 != 0) {
    fVar15 = ((i->input).mouse.pos.y - fVar24) / (fVar22 + -1.0);
    local_f8 = (float)(-(uint)(1.0 < fVar15) & 0x3f800000 |
                      ~-(uint)(1.0 < fVar15) & -(uint)(0.0 < fVar15) & 0x3f800000);
    fVar18 = fVar15;
    if (fVar15 <= 0.0) {
      fVar18 = local_f8;
    }
    iVar12 = 1;
    if (fVar15 <= 1.0) {
      local_f8 = fVar18;
    }
  }
  local_c8 = CONCAT44(fVar24,fVar24);
  uStack_c0 = CONCAT44(fVar24,fVar24);
  local_68._8_8_ = 0;
  local_68._0_8_ = CONCAT44(fVar24,local_a8);
  iVar8 = iVar12;
  if (fmt == NK_RGBA) {
    r_01.w = (float)local_b8._0_4_;
    r_01.h = (float)local_b8._4_4_;
    r_01.x = local_a8;
    r_01.y = fVar24;
    local_b8 = auVar16;
    iVar10 = nk_button_behavior(state,r_01,&i->input,NK_BUTTON_REPEATER);
    auVar17._8_8_ = 0;
    if (iVar10 != 0) {
      fVar15 = ((i->input).mouse.pos.y - (float)local_c8) / (fVar22 + -1.0);
      local_ec = (float)(-(uint)(1.0 < fVar15) & 0x3f800000 |
                        ~-(uint)(1.0 < fVar15) & -(uint)(0.0 < fVar15) & 0x3f800000);
      fVar18 = fVar15;
      if (fVar15 <= 0.0) {
        fVar18 = local_ec;
      }
      if (fVar15 <= 1.0) {
        local_ec = fVar18;
      }
      local_ec = 1.0 - local_ec;
      iVar8 = 1;
    }
  }
  pnVar6 = local_78;
  uVar9 = *state & 2 | 4;
  *state = uVar9;
  if (iVar12 != 0) {
    uVar9 = 0x22;
    nVar11 = nk_hsva_fv(&local_f8);
    auVar17._8_8_ = 0;
    *pnVar6 = nVar11;
    *state = 0x22;
  }
  if (iVar8 != 0) {
    pnVar6->a = (nk_byte)(int)(local_ec * 255.0);
    *state = 0x22;
    uVar9 = 0x22;
  }
  rect._0_8_ = auVar17._0_8_;
  rect.w = local_d8;
  rect.h = fStack_d4;
  iVar12 = nk_input_is_mouse_hovering_rect(&i->input,rect);
  if (iVar12 == 0) {
LAB_0013618a:
    rect_01.y = fVar24;
    rect_01.x = fVar23;
    rect_01.w = local_d8;
    rect_01.h = fStack_d4;
    iVar12 = nk_input_is_mouse_prev_hovering_rect(&i->input,rect_01);
    if (iVar12 == 0) goto LAB_001361ad;
    nVar14 = uVar9 | 0x40;
  }
  else {
    *state = 0x12;
    uVar9 = 0x12;
    rect_00.y = fVar24;
    rect_00.x = fVar23;
    rect_00.w = local_d8;
    rect_00.h = fStack_d4;
    iVar12 = nk_input_is_mouse_prev_hovering_rect(&i->input,rect_00);
    if (iVar12 != 0) goto LAB_0013618a;
    nVar14 = 0x1a;
  }
  *state = nVar14;
LAB_001361ad:
  b = &pnVar2->buffer;
  nVar11 = *pnVar6;
  nk_color_hsv_fv(&local_f8,nVar11);
  local_78 = (nk_color *)CONCAT44(fVar22 / 6.0 + 0.5,local_98._0_4_);
  uStack_70 = local_98._8_4_;
  uStack_6c = local_98._12_4_;
  lVar13 = 0;
  local_d8 = fVar22 / 6.0;
  while( true ) {
    if (lVar13 == 6) break;
    rect_02.y = (float)(int)lVar13 * local_d8 + (float)local_c8 + 0.5;
    rect_02.x = (float)local_e8;
    rect_02.w = (float)(undefined4)local_78;
    rect_02.h = (float)local_78._4_4_;
    nk_fill_rect_multi_color
              (b,rect_02,*(nk_color *)(&nk_draw_color_picker_hue_colors + lVar13),
               *(nk_color *)(&nk_draw_color_picker_hue_colors + lVar13),
               *(nk_color *)(&DAT_00157834 + lVar13),*(nk_color *)(&DAT_00157834 + lVar13));
    lVar13 = lVar13 + 1;
  }
  _local_d8 = CONCAT44(fStack_d4,local_f8);
  fVar18 = (float)(int)(local_f8 * fVar22 + (float)local_c8 + 0.5);
  nk_stroke_line(b,(float)local_e8 + -1.0,fVar18,local_a8 + 2.0,fVar18,1.0,(nk_color)0xffffffff);
  auVar16 = local_68;
  auVar17 = local_b8;
  if (fmt == NK_RGBA) {
    fVar18 = (float)((uint)nVar11 >> 0x18) / 255.0;
    auVar19 = ZEXT812(0x3f800000);
    if (fVar18 <= 1.0) {
      auVar19._4_8_ = 0;
      auVar19._0_4_ = fVar18;
    }
    if (auVar19._0_4_ <= 0.0) {
      auVar5._8_4_ = 0;
      auVar5._0_8_ = auVar19._4_8_;
      auVar19 = auVar5 << 0x20;
    }
    local_e8 = (ulong)(uint)(float)(int)((1.0 - auVar19._0_4_) * fVar22 + (float)local_c8 + 0.5);
    uStack_e0 = 0;
    rect_03.w = (float)local_b8._0_4_;
    rect_03.h = (float)local_b8._4_4_;
    rect_03.x = (float)local_68._0_4_;
    rect_03.y = (float)local_68._4_4_;
    local_b8 = auVar17;
    local_68 = auVar16;
    nk_fill_rect_multi_color
              (b,rect_03,(nk_color)0xffffffff,(nk_color)0xffffffff,(nk_color)0xff000000,
               (nk_color)0xff000000);
    nk_stroke_line(b,local_a8 + -1.0,(float)local_e8,(float)local_98._0_4_ + local_a8 + 2.0,
                   (float)local_e8,1.0,(nk_color)0xffffffff);
  }
  nVar11 = nk_hsv_f(local_d8,1.0,1.0);
  rect_04.y = fVar24;
  rect_04.x = fVar23;
  rect_04.w = (float)(undefined4)local_88;
  rect_04.h = (float)local_88._4_4_;
  nk_fill_rect_multi_color(b,rect_04,(nk_color)0xffffffff,nVar11,nVar11,(nk_color)0xffffffff);
  rect_05.y = fVar24;
  rect_05.x = fVar23;
  rect_05.w = (float)(undefined4)local_88;
  rect_05.h = (float)local_88._4_4_;
  nk_fill_rect_multi_color
            (b,rect_05,(nk_color)0x0,(nk_color)0x0,(nk_color)0xff000000,(nk_color)0xff000000);
  fVar15 = (float)(int)((float)local_58._0_4_ * local_f4 + fVar23);
  local_e8 = CONCAT44((float)(int)(float)local_58._4_4_,fVar15);
  uStack_e0 = CONCAT44((float)(int)fStack_4c,(float)(int)fStack_50);
  fVar18 = (float)(int)((1.0 - local_f0) * fVar22 + (float)local_c8);
  nk_stroke_line(b,fVar15 + -7.0,fVar18,fVar15 + -2.0,fVar18,1.0,(nk_color)0xffffffff);
  nk_stroke_line(b,(float)local_e8 + 7.0 + 1.0,fVar18,(float)local_e8 + 3.0,fVar18,1.0,
                 (nk_color)0xffffffff);
  nk_stroke_line(b,(float)local_e8,fVar18 + 7.0 + 1.0,(float)local_e8,fVar18 + 3.0,1.0,
                 (nk_color)0xffffffff);
  nk_stroke_line(b,(float)local_e8,fVar18 + -7.0,(float)local_e8,fVar18 + -2.0,1.0,
                 (nk_color)0xffffffff);
  return iVar8;
}

Assistant:

NK_API int
nk_color_pick(struct nk_context * ctx, struct nk_color *color,
    enum nk_color_format fmt)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_style *config;
    const struct nk_input *in;

    enum nk_widget_layout_states state;
    struct nk_rect bounds;

    NK_ASSERT(ctx);
    NK_ASSERT(color);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !color)
        return 0;

    win = ctx->current;
    config = &ctx->style;
    layout = win->layout;
    state = nk_widget(&bounds, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    return nk_do_color_picker(&ctx->last_widget_state, &win->buffer, color, fmt, bounds,
                nk_vec2(0,0), in, config->font);
}